

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

int __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
Subst_Forward(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>
              *this,TPZFMatrix<long_double> *b)

{
  DecomposeType dec;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Entering Forward Substitution\n",0x1e);
  std::ostream::flush();
  dec = TPZFrontSym<long_double>::GetDecomposeType(&this->fFront);
  TPZStackEqnStorage<long_double>::Forward(&this->fStorage,b,dec);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}